

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void genstep(lua_State *L,global_State *g)

{
  ulong uVar1;
  ulong uVar2;
  lu_mem lVar3;
  lu_mem numobjs;
  lu_mem majorinc;
  lu_mem majorbase;
  global_State *g_local;
  lua_State *L_local;
  
  if (g->lastatomic == 0) {
    uVar1 = g->GCestimate;
    uVar2 = (uVar1 / 100) * (long)(int)((uint)g->genmajormul << 2);
    if ((g->GCdebt < 1) || ((ulong)(g->totalbytes + g->GCdebt) <= uVar1 + uVar2)) {
      youngcollection(L,g);
      setminordebt(g);
      g->GCestimate = uVar1;
    }
    else {
      lVar3 = fullgen(L,g);
      if (uVar1 + (uVar2 >> 1) <= (ulong)(g->totalbytes + g->GCdebt)) {
        g->lastatomic = lVar3;
        setpause(g);
      }
    }
  }
  else {
    stepgenfull(L,g);
  }
  return;
}

Assistant:

static void genstep (lua_State *L, global_State *g) {
  if (g->lastatomic != 0)  /* last collection was a bad one? */
    stepgenfull(L, g);  /* do a full step */
  else {
    lu_mem majorbase = g->GCestimate;  /* memory after last major collection */
    lu_mem majorinc = (majorbase / 100) * getgcparam(g->genmajormul);
    if (g->GCdebt > 0 && gettotalbytes(g) > majorbase + majorinc) {
      lu_mem numobjs = fullgen(L, g);  /* do a major collection */
      if (gettotalbytes(g) < majorbase + (majorinc / 2)) {
        /* collected at least half of memory growth since last major
           collection; keep doing minor collections. */
        lua_assert(g->lastatomic == 0);
      }
      else {  /* bad collection */
        g->lastatomic = numobjs;  /* signal that last collection was bad */
        setpause(g);  /* do a long wait for next (major) collection */
      }
    }
    else {  /* regular case; do a minor collection */
      youngcollection(L, g);
      setminordebt(g);
      g->GCestimate = majorbase;  /* preserve base value */
    }
  }
  lua_assert(isdecGCmodegen(g));
}